

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_encoder.h
# Opt level: O2

_Bool rc_encode(lzma_range_encoder *rc,uint8_t *out,size_t *out_pos,size_t out_size)

{
  ushort uVar1;
  ushort *puVar2;
  _Bool _Var3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar5 = rc->count;
  if (0x3a < uVar5) {
    __assert_fail("rc->count <= RC_SYMBOLS_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/rangecoder/range_encoder.h"
                  ,0x99,"_Bool rc_encode(lzma_range_encoder *, uint8_t *, size_t *, size_t)");
  }
  uVar4 = rc->pos;
  do {
    if (uVar5 <= uVar4) goto LAB_003523a5;
    uVar6 = rc->range;
    if (uVar6 < 0x1000000) {
      _Var3 = rc_shift_low(rc,out,out_pos,out_size);
      if (_Var3) {
        return true;
      }
      uVar6 = rc->range << 8;
      rc->range = uVar6;
      uVar4 = rc->pos;
    }
    switch(rc->symbols[uVar4]) {
    case RC_BIT_0:
      puVar2 = rc->probs[uVar4];
      uVar1 = *puVar2;
      rc->range = (uVar6 >> 0xb) * (uint)uVar1;
      *puVar2 = (short)(0x800 - uVar1 >> 5) + uVar1;
      break;
    case RC_BIT_1:
      puVar2 = rc->probs[uVar4];
      uVar1 = *puVar2;
      uVar7 = (uVar6 >> 0xb) * (uint)uVar1;
      rc->low = rc->low + (ulong)uVar7;
      rc->range = uVar6 - uVar7;
      *puVar2 = uVar1 - (uVar1 >> 5);
      break;
    case RC_DIRECT_0:
      rc->range = uVar6 >> 1;
      break;
    case RC_DIRECT_1:
      rc->range = uVar6 >> 1;
      rc->low = rc->low + (ulong)(uVar6 >> 1);
      break;
    case RC_FLUSH:
      rc->range = 0xffffffff;
      do {
        _Var3 = rc_shift_low(rc,out,out_pos,out_size);
        if (_Var3) {
          return true;
        }
        uVar5 = rc->pos + 1;
        rc->pos = uVar5;
      } while (uVar5 < rc->count);
      rc->low = 0;
      rc->cache_size = 1;
      rc->range = 0xffffffff;
      rc->cache = '\0';
LAB_003523a5:
      rc->count = 0;
      rc->pos = 0;
      return false;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/rangecoder/range_encoder.h"
                    ,0xd3,"_Bool rc_encode(lzma_range_encoder *, uint8_t *, size_t *, size_t)");
    }
    uVar4 = uVar4 + 1;
    rc->pos = uVar4;
    uVar5 = rc->count;
  } while( true );
}

Assistant:

static inline bool
rc_encode(lzma_range_encoder *rc,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	assert(rc->count <= RC_SYMBOLS_MAX);

	while (rc->pos < rc->count) {
		// Normalize
		if (rc->range < RC_TOP_VALUE) {
			if (rc_shift_low(rc, out, out_pos, out_size))
				return true;

			rc->range <<= RC_SHIFT_BITS;
		}

		// Encode a bit
		switch (rc->symbols[rc->pos]) {
		case RC_BIT_0: {
			probability prob = *rc->probs[rc->pos];
			rc->range = (rc->range >> RC_BIT_MODEL_TOTAL_BITS)
					* prob;
			prob += (RC_BIT_MODEL_TOTAL - prob) >> RC_MOVE_BITS;
			*rc->probs[rc->pos] = prob;
			break;
		}

		case RC_BIT_1: {
			probability prob = *rc->probs[rc->pos];
			const uint32_t bound = prob * (rc->range
					>> RC_BIT_MODEL_TOTAL_BITS);
			rc->low += bound;
			rc->range -= bound;
			prob -= prob >> RC_MOVE_BITS;
			*rc->probs[rc->pos] = prob;
			break;
		}

		case RC_DIRECT_0:
			rc->range >>= 1;
			break;

		case RC_DIRECT_1:
			rc->range >>= 1;
			rc->low += rc->range;
			break;

		case RC_FLUSH:
			// Prevent further normalizations.
			rc->range = UINT32_MAX;

			// Flush the last five bytes (see rc_flush()).
			do {
				if (rc_shift_low(rc, out, out_pos, out_size))
					return true;
			} while (++rc->pos < rc->count);

			// Reset the range encoder so we are ready to continue
			// encoding if we weren't finishing the stream.
			rc_reset(rc);
			return false;

		default:
			assert(0);
			break;
		}

		++rc->pos;
	}

	rc->count = 0;
	rc->pos = 0;

	return false;
}